

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::
optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
::
initialize<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
          (optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
           *this,Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                 *value)

{
  bool bVar1;
  Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
  *value_local;
  optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
  *this_local;
  
  bVar1 = optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
          ::has_value((optional<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                       *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5dd,
                  "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<std::array<float, 4>>>>::initialize(V &&) [T = tinyusdz::Animatable<std::vector<std::array<float, 4>>>, V = tinyusdz::Animatable<std::vector<std::array<float, 4>>>]"
                 );
  }
  detail::
  storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
  ::construct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                     *)(this + 8),value);
  *this = (optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
           )0x1;
  return;
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }